

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxmlutils.cpp
# Opt level: O1

bool QXmlUtils::rangeContains(RangeIter begin,RangeIter end,QChar c)

{
  RangeIter pQVar1;
  char16_t cVar2;
  RangeIter pQVar3;
  RangeIter pQVar4;
  long lVar5;
  RangeIter pQVar6;
  char cVar7;
  
  if ((ushort)c.ucs <= begin->max) {
    cVar2 = begin->min;
LAB_00305180:
    return (ushort)cVar2 <= (ushort)c.ucs;
  }
  pQVar4 = begin + 1;
  if (pQVar4 != end) {
    if ((ushort)c.ucs <= begin[1].max) {
      cVar2 = pQVar4->min;
      goto LAB_00305180;
    }
    do {
      if (pQVar4 == end) {
        return false;
      }
      lVar5 = (long)end - (long)pQVar4 >> 2;
      pQVar1 = (RangeIter)
               (&pQVar4->min + (lVar5 - ((long)end - (long)pQVar4 >> 0x3f) & 0xfffffffffffffffe));
      pQVar6 = pQVar1;
      pQVar3 = pQVar4;
      if (((ushort)c.ucs < pQVar1->min) ||
         (cVar7 = '\x01', pQVar6 = end, pQVar3 = pQVar1, pQVar1->max < (ushort)c.ucs)) {
        pQVar4 = pQVar3;
        cVar7 = (lVar5 + 1U < 3) * '\x03';
        end = pQVar6;
      }
    } while (cVar7 == '\0');
    if (cVar7 != '\x03') {
      return true;
    }
  }
  return false;
}

Assistant:

bool QXmlUtils::rangeContains(RangeIter begin, RangeIter end, const QChar c)
{
    const ushort cp(c.unicode());

    // check the first two ranges "manually" as characters in that
    // range are checked very often and we avoid the binary search below.

    if (cp <= begin->max)
        return cp >= begin->min;

    ++begin;

    if (begin == end)
        return false;

    if (cp <= begin->max)
        return cp >= begin->min;

    while (begin != end) {
        qptrdiff delta = (end - begin) / 2;
        RangeIter mid = begin + delta;

        if (mid->min > cp)
            end = mid;
        else if (mid->max < cp)
            begin = mid;
        else
            return true;

        if (delta == 0)
            break;
    }

    return false;
}